

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O0

int getText(char *text)

{
  ggvector<unsigned_char> *pgVar1;
  uchar *__result;
  uchar *in_RDI;
  uchar *unaff_retaddr;
  
  pgVar1 = (ggvector<unsigned_char> *)GGWave::rxData();
  __result = ggvector<unsigned_char>::begin(pgVar1);
  pgVar1 = (ggvector<unsigned_char> *)GGWave::rxData();
  ggvector<unsigned_char>::end(pgVar1);
  std::copy<unsigned_char*,char*>(unaff_retaddr,in_RDI,(char *)__result);
  return 0;
}

Assistant:

EMSCRIPTEN_KEEPALIVE
        int getText(char * text) {
            std::copy(g_ggWave->rxData().begin(), g_ggWave->rxData().end(), text);
            return 0;
        }